

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.cpp
# Opt level: O2

void __thiscall cs222::Symbol::Symbol(Symbol *this,string *name,int *value,Type *type)

{
  std::__cxx11::string::string((string *)this,(string *)name);
  this->value = *value;
  this->type = *type;
  return;
}

Assistant:

Symbol::Symbol(
            const string& name,
            const int& value,
            const Type& type) :
        name(name), value(value), type(type) { }